

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testNonUpdatablePipelineWithOneUpdatableModelInsidePipelineHierarchy(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_1e8 [80];
  undefined1 local_198 [80];
  Result local_148;
  Result local_118;
  Model *m5;
  Model *m4;
  Pipeline *pipeline2;
  Model *m3;
  Model *m2;
  Model *m1;
  Pipeline *pipeline1;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesB._8_8_ = anon_var_dwarf_248cf;
  tensorAttributesC._8_8_ = (long)"RGB" + 2;
  tensorAttributesB.name = (char *)0x1;
  tensorAttributesD._8_8_ = (long)"LOC" + 2;
  tensorAttributesC.name = (char *)0x1;
  pipeline1 = (Pipeline *)0x46d27f;
  tensorAttributesD.name = (char *)0x3;
  m1 = (Model *)buildEmptyPipelineModelWithStringOutput
                          ((Model *)(local_68 + 0x28),false,
                           (TensorAttributes *)&tensorAttributesB.dimension,"E");
  m2 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  m3 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  pipeline2 = (Pipeline *)CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  buildBasicNeuralNetworkModel
            (m2,false,(TensorAttributes *)&tensorAttributesB.dimension,
             (TensorAttributes *)&tensorAttributesC.dimension,1,false,false);
  m4 = (Model *)buildEmptyPipelineModel
                          (m3,false,(TensorAttributes *)&tensorAttributesC.dimension,
                           (TensorAttributes *)&pipeline1);
  buildBasicNearestNeighborClassifier((Model *)pipeline2,false,(TensorAttributes *)&pipeline1,"E");
  m5 = CoreML::Specification::Pipeline::add_models((Pipeline *)m4);
  local_118.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::Pipeline::add_models((Pipeline *)m4);
  buildBasicNeuralNetworkModel
            (m5,false,(TensorAttributes *)&tensorAttributesC.dimension,
             (TensorAttributes *)&tensorAttributesD.dimension,1,false,false);
  buildBasicNeuralNetworkModel
            ((Model *)local_118.m_message._M_storage._M_storage,true,
             (TensorAttributes *)&tensorAttributesD.dimension,(TensorAttributes *)&pipeline1,1,false
             ,false);
  addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer
            ((Model *)local_118.m_message._M_storage._M_storage,"D");
  CoreML::Model::validate(&local_118,m2);
  CoreML::Result::operator=((Result *)local_68,&local_118);
  CoreML::Result::~Result(&local_118);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (bVar1) {
    CoreML::Model::validate(&local_148,m3);
    CoreML::Result::operator=((Result *)local_68,&local_148);
    CoreML::Result::~Result(&local_148);
    bVar1 = CoreML::Result::good((Result *)local_68);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x487);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"!((res).good())");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
    else {
      CoreML::Model::validate((Result *)(local_198 + 0x28),(Model *)pipeline2);
      CoreML::Result::operator=((Result *)local_68,(Result *)(local_198 + 0x28));
      CoreML::Result::~Result((Result *)(local_198 + 0x28));
      bVar1 = CoreML::Result::good((Result *)local_68);
      if (bVar1) {
        CoreML::Model::validate((Result *)local_198,m5);
        CoreML::Result::operator=((Result *)local_68,(Result *)local_198);
        CoreML::Result::~Result((Result *)local_198);
        bVar1 = CoreML::Result::good((Result *)local_68);
        if (bVar1) {
          CoreML::Model::validate
                    ((Result *)(local_1e8 + 0x28),(Model *)local_118.m_message._M_storage._M_storage
                    );
          CoreML::Result::operator=((Result *)local_68,(Result *)(local_1e8 + 0x28));
          CoreML::Result::~Result((Result *)(local_1e8 + 0x28));
          bVar1 = CoreML::Result::good((Result *)local_68);
          if (bVar1) {
            CoreML::Model::validate((Result *)local_1e8,(Model *)(local_68 + 0x28));
            CoreML::Result::operator=((Result *)local_68,(Result *)local_1e8);
            CoreML::Result::~Result((Result *)local_1e8);
            bVar1 = CoreML::Result::good((Result *)local_68);
            if (bVar1) {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x494);
              poVar2 = std::operator<<(poVar2,": error: ");
              poVar2 = std::operator<<(poVar2,"!((res).good())");
              poVar2 = std::operator<<(poVar2," was false, expected true.");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              spec._oneof_case_[0] = 1;
            }
            else {
              spec._oneof_case_[0] = 0;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x490);
            poVar2 = std::operator<<(poVar2,": error: ");
            poVar2 = std::operator<<(poVar2,"(res).good()");
            poVar2 = std::operator<<(poVar2," was false, expected true.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            spec._oneof_case_[0] = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48d);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(res).good()");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          spec._oneof_case_[0] = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48a);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(res).good()");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        spec._oneof_case_[0] = 1;
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x484);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(res).good()");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  local_148.m_message._M_storage._M_storage[4] = '\x01';
  local_148.m_message._M_storage._M_storage[5] = '\0';
  local_148.m_message._M_storage._M_storage[6] = '\0';
  local_148.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testNonUpdatablePipelineWithOneUpdatableModelInsidePipelineHierarchy() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline1 = buildEmptyPipelineModelWithStringOutput(spec, false, &tensorAttributesA, "E");

    auto m1 = pipeline1->add_models();
    auto m2 = pipeline1->add_models();
    auto m3 = pipeline1->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    auto pipeline2 = buildEmptyPipelineModel(*m2, false, &tensorAttributesB, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m3, false, &tensorAttributesD, "E");

    auto m4 = pipeline2->add_models();
    auto m5 = pipeline2->add_models();

    (void)buildBasicNeuralNetworkModel(*m4, false, &tensorAttributesB, &tensorAttributesC);
    (void)buildBasicNeuralNetworkModel(*m5, true, &tensorAttributesC, &tensorAttributesD);
    addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(*m5, "D");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m5);
    ML_ASSERT_GOOD(res);

    // expect validation to fail due to presence of uptable model in non-updatable pipeline.
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    return 0;
}